

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_profile_t *profile_00;
  parasail_profile_t *ppVar3;
  parasail_matrix_t *in_stack_00000070;
  int in_stack_0000007c;
  char *in_stack_00000080;
  int in_stack_000001d4;
  int in_stack_000001d8;
  int in_stack_000001dc;
  char *in_stack_000001e0;
  parasail_profile_t *in_stack_000001e8;
  int in_stack_00000594;
  int in_stack_00000598;
  int in_stack_0000059c;
  char *in_stack_000005a0;
  parasail_profile_t *in_stack_000005a8;
  parasail_result_t *result_final;
  parasail_profile_t *profile_final;
  int s2Len_new;
  int s1Len_new;
  parasail_result_t *result;
  parasail_matrix_t *matrix;
  char *s1;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  profile_local =
       (parasail_profile_t *)
       parasail_sw_striped_profile_avx2_256_32
                 (in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,in_stack_000001d8,
                  in_stack_000001d4);
  iVar2 = parasail_result_is_saturated((parasail_result_t *)profile_local);
  if (iVar2 == 0) {
    iVar2 = *(int *)((long)&profile_local->s1 + 4);
    iVar1 = profile_local->s1Len;
    profile_00 = parasail_profile_create_stats_avx_256_32
                           (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
    ppVar3 = (parasail_profile_t *)
             parasail_sw_stats_striped_profile_avx2_256_32_internal
                       (in_stack_000005a8,in_stack_000005a0,in_stack_0000059c,in_stack_00000598,
                        in_stack_00000594);
    parasail_profile_free(profile_00);
    parasail_result_free((parasail_result_t *)profile_local);
    *(int *)((long)&ppVar3->s1 + 4) = iVar2;
    ppVar3->s1Len = iVar1;
    profile_local = ppVar3;
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_32(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_32(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_32(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_32(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_32(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}